

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.cpp
# Opt level: O3

void __thiscall
wasm::SuffixTree::RepeatedSubstringIterator::advance(RepeatedSubstringIterator *this)

{
  pointer *pppSVar1;
  NodeKind NVar2;
  pointer puVar3;
  pointer puVar4;
  SuffixTreeInternalNode *this_00;
  SuffixTreeInternalNode *this_01;
  iterator __position;
  iterator __position_00;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  pointer ppSVar8;
  iterator __begin2;
  _Hash_node_base *p_Var9;
  undefined1 auVar10 [8];
  iterator __end2;
  undefined1 auStack_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> RepeatedSubstringStarts;
  SuffixTreeInternalNode *local_38;
  SuffixTreeInternalNode *InternalChild;
  
  (this->RS).Length = 0;
  puVar3 = (this->RS).StartIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->RS).StartIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->RS).StartIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RS).StartIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RS).StartIndices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)puVar4 - (long)puVar3);
  }
  this->N = (SuffixTreeNode *)0x0;
  RepeatedSubstringStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  RepeatedSubstringStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ppSVar8 = (this->InternalNodesToVisit).
            super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->InternalNodesToVisit).
      super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
      ._M_impl.super__Vector_impl_data._M_start != ppSVar8) {
    do {
      if ((undefined1  [8])
          RepeatedSubstringStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != auStack_58) {
        RepeatedSubstringStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_58;
      }
      this_00 = ppSVar8[-1];
      (this->InternalNodesToVisit).
      super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppSVar8 + -1;
      uVar6 = SuffixTreeNode::getConcatLen(&this_00->super_SuffixTreeNode);
      for (p_Var9 = (this_00->Children)._M_h._M_before_begin._M_nxt;
          p_Var9 != (_Hash_node_base *)0x0; p_Var9 = p_Var9->_M_nxt) {
        this_01 = (SuffixTreeInternalNode *)p_Var9[2]._M_nxt;
        if (this_01 == (SuffixTreeInternalNode *)0x0) {
          __assert_fail("Val && \"isa<> used on a null pointer\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Casting.h"
                        ,0x69,
                        "static bool llvm::isa_impl_cl<wasm::SuffixTreeInternalNode, const wasm::SuffixTreeNode *>::doit(const From *) [To = wasm::SuffixTreeInternalNode, From = const wasm::SuffixTreeNode *]"
                       );
        }
        NVar2 = (this_01->super_SuffixTreeNode).Kind;
        local_38 = (SuffixTreeInternalNode *)0x0;
        if (NVar2 == ST_Internal) {
          local_38 = this_01;
        }
        if (local_38 == (SuffixTreeInternalNode *)0x0) {
          if (this->MinLength <= uVar6) {
            if (NVar2 != ST_Leaf) {
              __assert_fail("isa<X>(Val) && \"cast<Ty>() argument of incompatible type!\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Casting.h"
                            ,0x108,
                            "typename cast_retty<X, Y *>::ret_type llvm::cast(Y *) [X = wasm::SuffixTreeLeafNode, Y = wasm::SuffixTreeNode]"
                           );
            }
            uVar7 = SuffixTreeLeafNode::getSuffixIdx((SuffixTreeLeafNode *)this_01);
            local_38 = (SuffixTreeInternalNode *)CONCAT44(local_38._4_4_,uVar7);
            if (RepeatedSubstringStarts.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start ==
                RepeatedSubstringStarts.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
              _M_realloc_insert<unsigned_int>
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58,
                         (iterator)
                         RepeatedSubstringStarts.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start,(uint *)&local_38);
            }
            else {
              *RepeatedSubstringStarts.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start = uVar7;
              RepeatedSubstringStarts.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   RepeatedSubstringStarts.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
            }
          }
        }
        else {
          __position._M_current =
               (this->InternalNodesToVisit).
               super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->InternalNodesToVisit).
              super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<wasm::SuffixTreeInternalNode*,std::allocator<wasm::SuffixTreeInternalNode*>>
            ::_M_realloc_insert<wasm::SuffixTreeInternalNode*const&>
                      ((vector<wasm::SuffixTreeInternalNode*,std::allocator<wasm::SuffixTreeInternalNode*>>
                        *)&this->InternalNodesToVisit,__position,&local_38);
          }
          else {
            *__position._M_current = local_38;
            pppSVar1 = &(this->InternalNodesToVisit).
                        super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppSVar1 = *pppSVar1 + 1;
          }
        }
      }
      bVar5 = SuffixTreeInternalNode::isRoot(this_00);
      puVar3 = RepeatedSubstringStarts.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((!bVar5) &&
         (4 < (ulong)((long)RepeatedSubstringStarts.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start - (long)auStack_58))) {
        this->N = &this_00->super_SuffixTreeNode;
        (this->RS).Length = uVar6;
        if (auStack_58 !=
            (undefined1  [8])
            RepeatedSubstringStarts.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          auVar10 = auStack_58;
          do {
            local_38 = (SuffixTreeInternalNode *)CONCAT44(local_38._4_4_,*(uint *)auVar10);
            __position_00._M_current =
                 (this->RS).StartIndices.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position_00._M_current ==
                (this->RS).StartIndices.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                         &(this->RS).StartIndices,__position_00,(uint *)&local_38);
            }
            else {
              *__position_00._M_current = *(uint *)auVar10;
              (this->RS).StartIndices.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish = __position_00._M_current + 1;
            }
            auVar10 = (undefined1  [8])((long)auVar10 + 4);
          } while (auVar10 != (undefined1  [8])puVar3);
        }
        break;
      }
      ppSVar8 = (this->InternalNodesToVisit).
                super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    } while ((this->InternalNodesToVisit).
             super__Vector_base<wasm::SuffixTreeInternalNode_*,_std::allocator<wasm::SuffixTreeInternalNode_*>_>
             ._M_impl.super__Vector_impl_data._M_start != ppSVar8);
  }
  if (auStack_58 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_58,
                    (long)RepeatedSubstringStarts.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)auStack_58);
  }
  return;
}

Assistant:

void SuffixTree::RepeatedSubstringIterator::advance() {
  // Clear the current state. If we're at the end of the range, then this
  // is the state we want to be in.
  RS = RepeatedSubstring();
  N = nullptr;

  // Each leaf node represents a repeat of a string.
  std::vector<unsigned> RepeatedSubstringStarts;

  // Continue visiting nodes until we find one which repeats more than once.
  while (!InternalNodesToVisit.empty()) {
    RepeatedSubstringStarts.clear();
    auto* Curr = InternalNodesToVisit.back();
    InternalNodesToVisit.pop_back();

    // Keep track of the length of the string associated with the node. If
    // it's too short, we'll quit.
    unsigned Length = Curr->getConcatLen();

    // Iterate over each child, saving internal nodes for visiting, and
    // leaf nodes in LeafChildren. Internal nodes represent individual
    // strings, which may repeat.
    for (auto& ChildPair : Curr->Children) {
      // Save all of this node's children for processing.
      if (auto* InternalChild =
            dyn_cast<SuffixTreeInternalNode>(ChildPair.second)) {
        InternalNodesToVisit.push_back(InternalChild);
        continue;
      }

      if (Length < MinLength) {
        continue;
      }

      // Have an occurrence of a potentially repeated string. Save it.
      auto* Leaf = cast<SuffixTreeLeafNode>(ChildPair.second);
      RepeatedSubstringStarts.push_back(Leaf->getSuffixIdx());
    }

    // The root never represents a repeated substring. If we're looking at
    // that, then skip it.
    if (Curr->isRoot()) {
      continue;
    }

    // Do we have any repeated substrings?
    if (RepeatedSubstringStarts.size() < 2) {
      continue;
    }

    // Yes. Update the state to reflect this, and then bail out.
    N = Curr;
    RS.Length = Length;
    for (unsigned StartIdx : RepeatedSubstringStarts) {
      RS.StartIndices.push_back(StartIdx);
    }
    break;
  }
  // At this point, either NewRS is an empty RepeatedSubstring, or it was
  // set in the above loop. Similarly, N is either nullptr, or the node
  // associated with NewRS.
}